

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixy-fwd.c
# Opt level: O0

int main(int argc,char **argv)

{
  device_stats *pdVar1;
  ulong uVar2;
  device_stats *stats;
  undefined8 *in_RSI;
  int in_EDI;
  uint64_t time;
  uint64_t counter;
  device_stats stats2_old;
  device_stats stats2;
  device_stats stats1_old;
  device_stats stats1;
  uint64_t last_stats_printed;
  ixy_device *dev2;
  ixy_device *dev1;
  ixy_device *in_stack_ffffffffffffff28;
  device_stats *in_stack_ffffffffffffff30;
  ixy_device *piVar3;
  ixy_device *dev;
  char *in_stack_ffffffffffffff38;
  uint64_t in_stack_ffffffffffffff50;
  device_stats *in_stack_ffffffffffffff58;
  device_stats *in_stack_ffffffffffffff60;
  undefined1 local_78 [40];
  undefined1 local_50 [40];
  device_stats *local_28;
  ixy_device *local_20;
  ixy_device *local_18;
  undefined8 *local_10;
  undefined4 local_4;
  
  local_4 = 0;
  if (in_EDI == 3) {
    local_18 = ixy_init(in_stack_ffffffffffffff38,
                        (uint16_t)((ulong)in_stack_ffffffffffffff30 >> 0x30),
                        (uint16_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                        (int)in_stack_ffffffffffffff30);
    local_20 = ixy_init(in_stack_ffffffffffffff38,
                        (uint16_t)((ulong)in_stack_ffffffffffffff30 >> 0x30),
                        (uint16_t)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                        (int)in_stack_ffffffffffffff30);
    local_28 = (device_stats *)monotonic_time();
    stats_init(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    stats_init(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    stats_init(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    stats_init(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
    piVar3 = (ixy_device *)0x0;
    pdVar1 = local_28;
    do {
      do {
        local_28 = pdVar1;
        forward((ixy_device *)stats2.rx_bytes,stats2.tx_pkts._6_2_,(ixy_device *)stats2.rx_pkts,
                stats2.device._6_2_);
        forward((ixy_device *)stats2.rx_bytes,stats2.tx_pkts._6_2_,(ixy_device *)stats2.rx_pkts,
                stats2.device._6_2_);
        dev = (ixy_device *)((long)&piVar3->pci_addr + 1);
        uVar2 = (ulong)piVar3 & 0xfff;
        piVar3 = dev;
        pdVar1 = local_28;
      } while (uVar2 != 0);
      stats = (device_stats *)monotonic_time();
      piVar3 = dev;
      pdVar1 = local_28;
      if (1000000000 < (ulong)((long)stats - (long)local_28)) {
        ixy_read_stats(dev,stats);
        print_stats_diff(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                         in_stack_ffffffffffffff50);
        memcpy(local_78,local_50,0x28);
        piVar3 = dev;
        pdVar1 = stats;
        if (local_18 != local_20) {
          ixy_read_stats(dev,stats);
          print_stats_diff(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,
                           in_stack_ffffffffffffff50);
          memcpy(&stack0xffffffffffffff38,&stack0xffffffffffffff60,0x28);
          piVar3 = dev;
          pdVar1 = stats;
        }
      }
    } while( true );
  }
  local_10 = in_RSI;
  printf("%s forwards packets between two ports.\n",*in_RSI);
  printf("Usage: %s <pci bus id2> <pci bus id1>\n",*local_10);
  return 1;
}

Assistant:

int main(int argc, char* argv[]) {
	if (argc != 3) {
		printf("%s forwards packets between two ports.\n", argv[0]);
		printf("Usage: %s <pci bus id2> <pci bus id1>\n", argv[0]);
		return 1;
	}

	struct ixy_device* dev1 = ixy_init(argv[1], 1, 1, -1);
	struct ixy_device* dev2 = ixy_init(argv[2], 1, 1, 0);

	uint64_t last_stats_printed = monotonic_time();
	struct device_stats stats1, stats1_old;
	struct device_stats stats2, stats2_old;
	stats_init(&stats1, dev1);
	stats_init(&stats1_old, dev1);
	stats_init(&stats2, dev2);
	stats_init(&stats2_old, dev2);

	uint64_t counter = 0;
	while (true) {
		forward(dev1, 0, dev2, 0);
		forward(dev2, 0, dev1, 0);

		// don't poll the time unnecessarily
		if ((counter++ & 0xFFF) == 0) {
			uint64_t time = monotonic_time();
			if (time - last_stats_printed > 1000 * 1000 * 1000) {
				// every second
				ixy_read_stats(dev1, &stats1);
				print_stats_diff(&stats1, &stats1_old, time - last_stats_printed);
				stats1_old = stats1;
				if (dev1 != dev2) {
					ixy_read_stats(dev2, &stats2);
					print_stats_diff(&stats2, &stats2_old, time - last_stats_printed);
					stats2_old = stats2;
				}
				last_stats_printed = time;
			}
		}
	}
}